

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O1

void __thiscall OpenMD::P2OrderParameter::writeP2(P2OrderParameter *this)

{
  double dVar1;
  pointer pOVar2;
  pointer pOVar3;
  uint i_1;
  ostream *poVar4;
  long lVar5;
  Vector3d *pVVar6;
  long lVar7;
  uint i;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  ofstream os;
  double local_250;
  double local_248 [4];
  double local_228;
  double dStack_220;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream
            ((ostream *)&local_210,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,
             _S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#P2 Order parameter\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"#selection1: (",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,(this->selectionScript1_)._M_dataplus._M_p,
                      (this->selectionScript1_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\t",2);
  if (this->doVect_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"selection2: (",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,(this->selectionScript2_)._M_dataplus._M_p,
                        (this->selectionScript2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n",0x33);
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_248[2] = 0.0;
  pOVar2 = (this->orderParams_).
           super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (this->orderParams_).
           super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pOVar3 - (long)pOVar2 >> 3) * -0x3333333333333333;
  if (pOVar3 == pOVar2) {
    dVar9 = 0.0;
    local_250 = 0.0;
  }
  else {
    pVVar6 = &pOVar2->director;
    dVar9 = 0.0;
    local_250 = 0.0;
    lVar7 = 0;
    do {
      dVar1 = pOVar2[lVar7].p2;
      lVar8 = 0;
      do {
        local_248[lVar8] = (pVVar6->super_Vector<double,_3U>).data_[lVar8] + local_248[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_250 = local_250 + pOVar2[lVar7].angle;
      dVar9 = dVar9 + dVar1;
      lVar7 = lVar7 + 1;
      pVVar6 = (Vector3d *)((long)(pVVar6 + 1) + 0x10);
    } while (lVar7 != lVar5 + (ulong)(lVar5 == 0));
  }
  auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar10._0_8_ = lVar5;
  auVar10._12_4_ = 0x45300000;
  dStack_220 = auVar10._8_8_ - 1.9342813113834067e+25;
  local_228 = dStack_220 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  lVar5 = 0;
  do {
    local_248[lVar5] = local_248[lVar5] / local_228;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  poVar4 = std::ostream::_M_insert<double>(dVar9 / local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<double>(local_248[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<double>(local_248[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<double>(local_248[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<double>(local_250 / local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void P2OrderParameter::writeP2() {
    ofstream os(getOutputFileName().c_str());
    os << "#P2 Order parameter\n";
    os << "#selection1: (" << selectionScript1_ << ")\t";
    if (!doVect_) { os << "selection2: (" << selectionScript2_ << ")\n"; }
    os << "#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n";

    RealType p2Sum {};
    RealType angleSum {};
    Vector3d directorSum(0.0);

    for (size_t i = 0; i < orderParams_.size(); ++i) {
      p2Sum += orderParams_[i].p2;
      directorSum += orderParams_[i].director;
      angleSum += orderParams_[i].angle;
    }

    p2Sum /= orderParams_.size();
    directorSum /= orderParams_.size();
    angleSum /= orderParams_.size();

    os << p2Sum << "\t" << directorSum[0] << "\t" << directorSum[1] << "\t"
       << directorSum[2] << "\t" << angleSum << "\n";
  }